

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void utf8_suite::test_00(void)

{
  char input [4];
  decoder_type decoder;
  value_type local_144 [4];
  undefined4 local_140;
  value local_13c;
  basic_decoder<char> local_138;
  
  local_138.input.tail = (const_pointer)&local_140;
  local_144[0] = '\"';
  local_144[1] = '\0';
  local_144[2] = '\"';
  local_144[3] = '\0';
  local_138.input.head = local_144;
  memset(&local_138.current,0,0x120);
  local_138.current.code = uninitialized;
  local_138.current.view.head = (const_pointer)0x0;
  local_138.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_138);
  local_13c = local_138.current.code;
  local_140 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x759,"void utf8_suite::test_00()",&local_13c,&local_140);
  return;
}

Assistant:

void api_true()
{
    const char input[] = "true";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::true_value);
}